

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdPubkeyTweakMul(void *handle,char *pubkey,char *tweak,char **output)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ByteData256 tweak_data;
  Pubkey key;
  string *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe30;
  Pubkey local_1b0;
  string local_198;
  allocator local_171;
  string local_170;
  ByteData256 local_150;
  allocator local_131;
  string local_130;
  Pubkey local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x5c9;
    local_50.funcname = "CfdPubkeyTweakMul";
    cfd::core::logger::warn<>(&local_50,"output is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. output is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdf0,error_code,in_stack_fffffffffffffde0);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(local_20);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,local_18,&local_131);
      cfd::core::Pubkey::Pubkey(&local_110,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      paVar4 = &local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,local_20,paVar4);
      cfd::core::ByteData256::ByteData256(&local_150,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      cfd::core::Pubkey::CreateTweakMul(&local_1b0,&local_110,&local_150);
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_198,&local_1b0);
      pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe30);
      *local_28 = pcVar3;
      std::__cxx11::string::~string((string *)&local_198);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5da1c3);
      local_4 = 0;
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5da1db);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5da1e8);
      return local_4;
    }
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x5d5;
    local_d0.funcname = "CfdPubkeyTweakMul";
    cfd::core::logger::warn<>(&local_d0,"tweak is null or empty.");
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to parameter. tweak is null or empty.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdf0,error_code,in_stack_fffffffffffffde0);
    local_f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x5cf;
  local_90.funcname = "CfdPubkeyTweakMul";
  cfd::core::logger::warn<>(&local_90,"pubkey is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. pubkey is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffdf0,error_code,in_stack_fffffffffffffde0);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdPubkeyTweakMul(
    void* handle, const char* pubkey, const char* tweak, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    Pubkey key(pubkey);
    ByteData256 tweak_data(tweak);
    *output = CreateString(key.CreateTweakMul(tweak_data).GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}